

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O2

void __thiscall
MxxReduce_GlobalScan_Test::MxxReduce_GlobalScan_Test(MxxReduce_GlobalScan_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001aafc0;
  return;
}

Assistant:

TEST(MxxReduce, GlobalScan) {
    mxx::comm c;
    // test reduce with zero elements for some processes
    size_t n = 0;
    int presize = 0;
    if (c.rank() % 2 == 0) {
        n = (c.rank()/2+1);
        presize = n*(n-1)/2;
    }
    std::vector<int> local(n);
    for (size_t i = 0; i < n; ++i) {
        local[i] = presize + i + 1;
    }
    // test inplace scan
    std::vector<int> local_cpy(local);
    mxx::global_scan_inplace(local_cpy.begin(), local_cpy.end(), c);
    for (size_t i = 0; i < n; ++i) {
        ASSERT_EQ(local[i]*(local[i]+1)/2, local_cpy[i]);
    }
    // test scan
    //std::vector<int> result(local.size());
    std::vector<int> result = mxx::global_scan(local, [](int x, int y) {return x+y;});
    ASSERT_EQ(local.size(), result.size());
    for (size_t i = 0; i < n; ++i) {
        ASSERT_EQ(local[i]*(local[i]+1)/2, result[i]);
    }
}